

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argh.h
# Opt level: O0

bool __thiscall argh::parser::is_number(parser *this,string *arg)

{
  byte bVar1;
  byte local_1ba;
  double local_1a0;
  double number;
  istringstream istr;
  string *arg_local;
  parser *this_local;
  
  std::__cxx11::istringstream::istringstream((istringstream *)&number,(string *)arg,_S_in);
  std::istream::operator>>((istream *)&number,&local_1a0);
  bVar1 = std::ios::fail();
  local_1ba = 1;
  if ((bVar1 & 1) == 0) {
    local_1ba = std::ios::bad();
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)&number);
  return (bool)((local_1ba ^ 0xff) & 1);
}

Assistant:

inline bool parser::is_number(std::string const& arg) const
	{
		// inefficient but simple way to determine if a string is a number (which can start with a '-')
		std::istringstream istr(arg);
		double number;
		istr >> number;
		return !(istr.fail() || istr.bad());
	}